

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

void __thiscall MppMemService::~MppMemService(MppMemService *this)

{
  Mutex *this_00;
  int iVar1;
  undefined8 in_stack_ffffffffffffffa8;
  size_t local_38;
  size_t size;
  MppMemNode *node;
  undefined1 local_20 [4];
  RK_S32 i;
  AutoMutex auto_lock;
  MppMemService *this_local;
  
  auto_lock.mLock = (Mutex *)this;
  if ((this->debug & 1) != 0) {
    Mutex::Autolock::Autolock((Autolock *)local_20,this->m_lock,1);
    node._4_4_ = 0;
    size = (size_t)this->nodes;
    local_38 = 0;
    del_node(this,"~MppMemService",this,&local_38);
    del_node(this,"~MppMemService",this->nodes,&local_38);
    del_node(this,"~MppMemService",this->frees,&local_38);
    del_node(this,"~MppMemService",this->logs,&local_38);
    if (this->nodes_cnt != 0) {
      for (node._4_4_ = 0; node._4_4_ < this->nodes_max; node._4_4_ = node._4_4_ + 1) {
        if (-1 < *(int *)size) {
          _mpp_log_l(4,"mpp_mem","found idx %8d mem %10p size %d leaked\n",(char *)0x0,
                     (ulong)*(uint *)size,*(undefined8 *)(size + 0x10),*(undefined8 *)(size + 8));
          this->nodes_cnt = this->nodes_cnt + -1;
          in_stack_ffffffffffffffa8 = 0;
          add_log(this,MEM_FREE,"~MppMemService",*(void **)(size + 0x10),(void *)0x0,
                  *(size_t *)(size + 8),0);
        }
        size = size + 0x20;
      }
      if (this->nodes_cnt != 0) {
        in_stack_ffffffffffffffa8 = CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x117);
        _mpp_log_l(2,"mpp_mem","Assertion %s failed at %s:%d\n",(char *)0x0,"nodes_cnt == 0",
                   "~MppMemService",in_stack_ffffffffffffffa8);
        if ((mpp_debug & 0x10000000) != 0) {
          abort();
        }
      }
    }
    if (this->frees_cnt != 0) {
      size = (size_t)this->frees;
      for (node._4_4_ = 0; node._4_4_ < this->frees_max; node._4_4_ = node._4_4_ + 1) {
        if (-1 < *(int *)size) {
          iVar1 = 0;
          if ((this->debug & 0x10) != 0) {
            iVar1 = 0x20;
          }
          os_free((void *)(*(long *)(size + 0x10) - (long)iVar1));
          *(uint *)size = *(uint *)size ^ 0xffffffff;
          this->frees_cnt = this->frees_cnt + -1;
          in_stack_ffffffffffffffa8 = 0;
          add_log(this,MEM_FREE_DELAY,"~MppMemService",*(void **)(size + 0x10),(void *)0x0,
                  *(size_t *)(size + 8),0);
        }
        size = size + 0x20;
      }
      if ((this->frees_cnt != 0) &&
         (_mpp_log_l(2,"mpp_mem","Assertion %s failed at %s:%d\n",(char *)0x0,"frees_cnt == 0",
                     "~MppMemService",
                     CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x128)),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
    }
    os_free(this->nodes);
    os_free(this->frees);
    os_free(this->logs);
    Mutex::Autolock::~Autolock((Autolock *)local_20);
  }
  if (this->m_lock != (Mutex *)0x0) {
    this_00 = this->m_lock;
    if (this_00 != (Mutex *)0x0) {
      Mutex::~Mutex(this_00);
      operator_delete(this_00,0x28);
    }
    this->m_lock = (Mutex *)0x0;
  }
  return;
}

Assistant:

MppMemService::~MppMemService()
{
    if (debug & MEM_DEBUG_EN) {
        AutoMutex auto_lock(m_lock);

        RK_S32 i = 0;
        MppMemNode *node = nodes;

        // delete self node first
        size_t size = 0;

        del_node(__FUNCTION__, this,  &size);
        del_node(__FUNCTION__, nodes, &size);
        del_node(__FUNCTION__, frees, &size);
        del_node(__FUNCTION__, logs,  &size);

        // then check leak memory
        if (nodes_cnt) {
            for (i = 0; i < nodes_max; i++, node++) {
                if (node->index >= 0) {
                    mpp_log("found idx %8d mem %10p size %d leaked\n",
                            node->index, node->ptr, node->size);
                    nodes_cnt--;
                    add_log(MEM_FREE, __FUNCTION__, node->ptr, NULL,
                            node->size, 0);
                }
            }

            mpp_assert(nodes_cnt == 0);
        }

        // finally release all delay free memory
        if (frees_cnt) {
            node = frees;

            for (i = 0; i < frees_max; i++, node++) {
                if (node->index >= 0) {
                    os_free((RK_U8 *)node->ptr - MEM_HEAD_ROOM(debug));
                    node->index = ~node->index;
                    frees_cnt--;
                    add_log(MEM_FREE_DELAY, __FUNCTION__, node->ptr, NULL,
                            node->size, 0);
                }
            }

            mpp_assert(frees_cnt == 0);
        }

        os_free(nodes);
        os_free(frees);
        os_free(logs);
    }

    if (m_lock) {
        delete m_lock;
        m_lock = NULL;
    }
}